

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_string_stream.hpp
# Opt level: O0

bool iutest::detail::StringToValue(string *s,float *out)

{
  float fVar1;
  float *out_local;
  string *s_local;
  
  fVar1 = std::__cxx11::stof(s,(size_t *)0x0);
  *out = fVar1;
  return true;
}

Assistant:

inline bool StringToValue(const ::std::string& s, float& out)
{
#if IUTEST_HAS_STD_STR_TO_VALUE
    out = ::std::stof(s);
#else
    char* endptr=NULL;
    const char* p = s.c_str();
    errno = 0;
#if !defined(IUTEST_OS_WINDOWS_MINGW) || !defined(__STRICT_ANSI__)
    const floating_point<float> v = strtof(p, &endptr);
#else
    const floating_point<float> v = static_cast<float>(strtod(p, &endptr));
#endif
    if(p == endptr)
    {
#if IUTEST_HAS_EXCEPTIONS
        throw ::std::invalid_argument(p);
#else
        return false;
#endif
    }
    if((errno == ERANGE) || v.is_inf() )
    {
#if IUTEST_HAS_EXCEPTIONS
        throw ::std::out_of_range(p);
#else
        return false;
#endif
    }
    out = v;
#endif
    return true;
}